

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O1

bool __thiscall ExchCXX::detail::LibxcKernelImpl::needs_tau_(LibxcKernelImpl *this)

{
  return (bool)(*(byte *)((long)&((this->kernel_).info)->flags + 2) & 1);
}

Assistant:

bool LibxcKernelImpl::needs_tau_() const noexcept {
  return
#if XC_MAJOR_VERSION > 6
    kernel_.info->flags & XC_FLAGS_NEEDS_TAU;
#else
    is_mgga_();
#endif
}